

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O1

void __thiscall
Assimp::ASEImporter::ConvertMeshes
          (ASEImporter *this,Mesh *mesh,vector<aiMesh_*,_std::allocator<aiMesh_*>_> *avOutMeshes)

{
  vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>> *this_00;
  vector<aiVertexWeight,std::allocator<aiVertexWeight>> *this_01;
  uint uVar1;
  Parser *pPVar2;
  iterator iVar3;
  pointer pBVar4;
  pointer pBVar5;
  pointer paVar6;
  iterator __position;
  pointer paVar7;
  pointer paVar8;
  pointer paVar9;
  iterator __position_00;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  pair<unsigned_int,_float> pVar15;
  aiVertexWeight aVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  pointer pMVar20;
  uint uVar21;
  ulong uVar22;
  Logger *pLVar23;
  ulong uVar24;
  ulong uVar25;
  ulong *puVar26;
  aiMesh *paVar27;
  ulong *puVar28;
  aiFace *paVar29;
  aiVector3D *paVar30;
  _func_int **pp_Var31;
  uint *puVar32;
  aiColor4D *paVar33;
  aiBone **ppaVar34;
  aiBone *paVar35;
  aiVertexWeight *paVar36;
  void *pvVar37;
  pointer pFVar38;
  aiFace *paVar39;
  pointer pMVar40;
  int iVar41;
  iterator __position_01;
  long lVar42;
  uint uVar43;
  uint c;
  pointer *ppaVar44;
  pointer ppVar45;
  long lVar46;
  pointer pBVar47;
  aiMesh *p_pcOut;
  aiVertexWeight weight;
  vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> vSubMaterials;
  undefined8 local_a8;
  aiMesh *local_a0;
  pair<unsigned_int,_float> local_98;
  pointer local_90;
  aiBone **local_88;
  vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> local_80;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_68;
  ulong local_60;
  ulong *local_58;
  vector<aiMesh*,std::allocator<aiMesh*>> *local_50;
  ASEImporter *local_48;
  ulong *local_40;
  ulong local_38;
  
  uVar22 = ((long)(this->mParser->m_vMaterials).
                  super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->mParser->m_vMaterials).
                  super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 5) * -0x2c8590b21642c859;
  local_50 = (vector<aiMesh*,std::allocator<aiMesh*>> *)avOutMeshes;
  local_48 = this;
  if (uVar22 < mesh->iMaterialIndex || uVar22 - mesh->iMaterialIndex == 0) {
    mesh->iMaterialIndex = (int)uVar22 - 1;
    pLVar23 = DefaultLogger::get();
    Logger::warn(pLVar23,"Material index is out of range");
  }
  pPVar2 = local_48->mParser;
  uVar21 = mesh->iMaterialIndex;
  pMVar40 = (pPVar2->m_vMaterials).
            super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       &pMVar40[uVar21].avSubMaterials.
        super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl ==
      *(pointer *)
       ((long)&pMVar40[uVar21].avSubMaterials.
               super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
               _M_impl + 8)) {
    paVar27 = (aiMesh *)operator_new(0x520);
    paVar27->mPrimitiveTypes = 0;
    paVar27->mNumVertices = 0;
    paVar27->mNumFaces = 0;
    memset(&paVar27->mVertices,0,0xcc);
    paVar27->mBones = (aiBone **)0x0;
    paVar27->mMaterialIndex = 0;
    (paVar27->mName).length = 0;
    (paVar27->mName).data[0] = '\0';
    memset((paVar27->mName).data + 1,0x1b,0x3ff);
    paVar27->mNumAnimMeshes = 0;
    paVar27->mAnimMeshes = (aiAnimMesh **)0x0;
    paVar27->mMethod = 0;
    (paVar27->mAABB).mMin.x = 0.0;
    (paVar27->mAABB).mMin.y = 0.0;
    (paVar27->mAABB).mMin.z = 0.0;
    (paVar27->mAABB).mMax.x = 0.0;
    (paVar27->mAABB).mMax.y = 0.0;
    (paVar27->mAABB).mMax.z = 0.0;
    paVar27->mTextureCoords[0] = (aiVector3D *)0x0;
    paVar27->mTextureCoords[1] = (aiVector3D *)0x0;
    paVar27->mTextureCoords[2] = (aiVector3D *)0x0;
    paVar27->mTextureCoords[3] = (aiVector3D *)0x0;
    paVar27->mTextureCoords[4] = (aiVector3D *)0x0;
    paVar27->mTextureCoords[5] = (aiVector3D *)0x0;
    paVar27->mTextureCoords[6] = (aiVector3D *)0x0;
    paVar27->mTextureCoords[7] = (aiVector3D *)0x0;
    paVar27->mNumUVComponents[0] = 0;
    paVar27->mNumUVComponents[1] = 0;
    paVar27->mNumUVComponents[2] = 0;
    paVar27->mNumUVComponents[3] = 0;
    paVar27->mNumUVComponents[4] = 0;
    paVar27->mNumUVComponents[5] = 0;
    paVar27->mNumUVComponents[6] = 0;
    paVar27->mNumUVComponents[7] = 0;
    paVar27->mColors[0] = (aiColor4D *)0x0;
    paVar27->mColors[1] = (aiColor4D *)0x0;
    paVar27->mColors[2] = (aiColor4D *)0x0;
    paVar27->mColors[3] = (aiColor4D *)0x0;
    paVar27->mColors[4] = (aiColor4D *)0x0;
    paVar27->mColors[5] = (aiColor4D *)0x0;
    paVar27->mColors[6] = (aiColor4D *)0x0;
    paVar27->mColors[7] = (aiColor4D *)0x0;
    paVar27->mPrimitiveTypes = 4;
    paVar27->mMaterialIndex = 0xffffffff;
    (pPVar2->m_vMaterials).
    super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>._M_impl.
    super__Vector_impl_data._M_start[uVar21].bNeed = true;
    paVar27->mColors[3] = (aiColor4D *)(ulong)mesh->iMaterialIndex;
    paVar27->mColors[2] = (aiColor4D *)mesh;
    iVar3._M_current = *(aiMesh ***)(local_50 + 8);
    local_a8 = paVar27;
    if (iVar3._M_current == *(aiMesh ***)(local_50 + 0x10)) {
      std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                (local_50,iVar3,(aiMesh **)&local_a8);
    }
    else {
      *iVar3._M_current = paVar27;
      *(long *)(local_50 + 8) = *(long *)(local_50 + 8) + 8;
    }
    paVar27 = local_a8;
    if ((mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
        super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
        super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      paVar6 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      paVar7 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (paVar6 != paVar7) {
        local_a8->mNumVertices = (int)((ulong)((long)paVar7 - (long)paVar6) >> 2) * -0x55555555;
        uVar21 = (int)((long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                             super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                             super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x3e0f83e1;
        local_a8->mNumFaces = uVar21;
        uVar22 = (ulong)uVar21;
        puVar28 = (ulong *)operator_new__(uVar22 * 0x10 + 8);
        *puVar28 = uVar22;
        paVar29 = (aiFace *)(puVar28 + 1);
        if (uVar22 != 0) {
          paVar39 = paVar29;
          do {
            paVar39->mNumIndices = 0;
            paVar39->mIndices = (uint *)0x0;
            paVar39 = paVar39 + 1;
          } while (paVar39 != paVar29 + uVar22);
        }
        local_a0 = paVar27;
        paVar27->mFaces = paVar29;
        paVar6 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        paVar7 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = ((long)paVar7 - (long)paVar6 >> 2) * -0x5555555555555555;
        uVar22 = SUB168(auVar12 * ZEXT816(0xc),0);
        if (SUB168(auVar12 * ZEXT816(0xc),8) != 0) {
          uVar22 = 0xffffffffffffffff;
        }
        paVar30 = (aiVector3D *)operator_new__(uVar22);
        lVar46 = (long)paVar7 - (long)paVar6;
        if (lVar46 != 0) {
          memset(paVar30,0,((lVar46 - 0xcU) / 0xc) * 0xc + 0xc);
        }
        paVar27 = local_a0;
        local_a0->mVertices = paVar30;
        paVar6 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        memcpy(paVar30,paVar6,
               (long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)paVar6);
        paVar6 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        paVar7 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = ((long)paVar7 - (long)paVar6 >> 2) * -0x5555555555555555;
        uVar22 = 0xffffffffffffffff;
        if (SUB168(auVar13 * ZEXT816(0xc),8) == 0) {
          uVar22 = SUB168(auVar13 * ZEXT816(0xc),0);
        }
        paVar30 = (aiVector3D *)operator_new__(uVar22);
        lVar46 = (long)paVar7 - (long)paVar6;
        if (lVar46 != 0) {
          memset(paVar30,0,((lVar46 - 0xcU) / 0xc) * 0xc + 0xc);
        }
        paVar27->mNormals = paVar30;
        paVar6 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        memcpy(paVar30,paVar6,
               (long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)paVar6);
        ppaVar44 = &mesh->amTexCoords[0].
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        lVar46 = 0;
        do {
          if (((_Vector_impl_data *)(ppaVar44 + -1))->_M_start != *ppaVar44) {
            lVar42 = (long)*ppaVar44 - (long)((_Vector_impl_data *)(ppaVar44 + -1))->_M_start;
            auVar14._8_8_ = 0;
            auVar14._0_8_ = (lVar42 >> 2) * -0x5555555555555555;
            uVar22 = SUB168(auVar14 * ZEXT816(0xc),0);
            if (SUB168(auVar14 * ZEXT816(0xc),8) != 0) {
              uVar22 = 0xffffffffffffffff;
            }
            pvVar37 = operator_new__(uVar22);
            memset(pvVar37,0,((lVar42 - 0xcU) / 0xc) * 0xc + 0xc);
            *(void **)((long)local_a8->mTextureCoords + lVar46 * 2) = pvVar37;
            memcpy(*(void **)((long)local_a8->mTextureCoords + lVar46 * 2),
                   ((_Vector_impl_data *)(ppaVar44 + -1))->_M_start,
                   (long)*ppaVar44 - (long)((_Vector_impl_data *)(ppaVar44 + -1))->_M_start);
            *(undefined4 *)((long)local_a8->mNumUVComponents + lVar46) =
                 *(undefined4 *)((long)mesh->mNumUVComponents + lVar46);
          }
          ppaVar44 = ppaVar44 + 3;
          lVar46 = lVar46 + 4;
        } while (lVar46 != 0x20);
        paVar8 = (mesh->mVertexColors).
                 super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        paVar9 = (mesh->mVertexColors).
                 super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (paVar8 != paVar9) {
          uVar24 = (long)paVar9 - (long)paVar8;
          uVar22 = 0xffffffffffffffff;
          if (-1 < (long)uVar24) {
            uVar22 = uVar24;
          }
          paVar33 = (aiColor4D *)operator_new__(uVar22);
          memset(paVar33,0,(uVar24 - 0x10 & 0xfffffffffffffff0) + 0x10);
          local_a8->mColors[0] = paVar33;
          paVar8 = (mesh->mVertexColors).
                   super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                   super__Vector_impl_data._M_start;
          memcpy(paVar33,paVar8,
                 (long)(mesh->mVertexColors).
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar8);
        }
        if (local_a8->mNumFaces != 0) {
          lVar46 = 0;
          lVar42 = 0;
          uVar22 = 0;
          do {
            *(undefined4 *)((long)&local_a8->mFaces->mNumIndices + lVar42) = 3;
            pvVar37 = operator_new__(0xc);
            *(void **)((long)&local_a8->mFaces->mIndices + lVar42) = pvVar37;
            **(undefined4 **)((long)&local_a8->mFaces->mIndices + lVar42) =
                 *(undefined4 *)
                  ((long)(((mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                           super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_FaceWithSmoothingGroup)
                         .mIndices + lVar46);
            *(undefined4 *)(*(long *)((long)&local_a8->mFaces->mIndices + lVar42) + 4) =
                 *(undefined4 *)
                  ((long)(((mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                           super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_FaceWithSmoothingGroup)
                         .mIndices + lVar46 + 4);
            *(undefined4 *)(*(long *)((long)&local_a8->mFaces->mIndices + lVar42) + 8) =
                 *(undefined4 *)
                  ((long)(((mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                           super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_FaceWithSmoothingGroup)
                         .mIndices + lVar46 + 8);
            uVar22 = uVar22 + 1;
            lVar42 = lVar42 + 0x10;
            lVar46 = lVar46 + 0x84;
          } while (uVar22 < local_a8->mNumFaces);
        }
        pBVar4 = (mesh->mBones).
                 super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pBVar5 = (mesh->mBones).
                 super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((pBVar4 != pBVar5) &&
           ((mesh->mBoneVertices).
            super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (mesh->mBoneVertices).
            super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>.
            _M_impl.super__Vector_impl_data._M_finish)) {
          std::
          vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
          ::vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                    *)&local_80,(long)pBVar5 - (long)pBVar4 >> 5,(allocator_type *)&local_98);
          pBVar47 = (mesh->mBoneVertices).
                    super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (pBVar47 !=
              (mesh->mBoneVertices).
              super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            uVar21 = 0;
            do {
              for (ppVar45 = (pBVar47->mBoneWeights).
                             super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  ppVar45 !=
                  (pBVar47->mBoneWeights).
                  super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; ppVar45 = ppVar45 + 1) {
                local_98.second = ppVar45->second;
                this_01 = (vector<aiVertexWeight,std::allocator<aiVertexWeight>> *)
                          (&((local_80.
                              super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                              ._M_impl.super__Vector_impl_data._M_start)->super_Material).
                            _vptr_Material + (long)ppVar45->first * 3);
                __position_00._M_current = *(aiVertexWeight **)(this_01 + 8);
                local_98.first = uVar21;
                if (__position_00._M_current == *(aiVertexWeight **)(this_01 + 0x10)) {
                  std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>::
                  _M_realloc_insert<aiVertexWeight_const&>
                            (this_01,__position_00,(aiVertexWeight *)&local_98);
                }
                else {
                  aVar16.mWeight = local_98.second;
                  aVar16.mVertexId = uVar21;
                  *__position_00._M_current = aVar16;
                  *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
                }
              }
              pBVar47 = pBVar47 + 1;
              uVar21 = uVar21 + 1;
            } while (pBVar47 !=
                     (mesh->mBoneVertices).
                     super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          paVar27 = local_a8;
          local_a8->mNumBones = 0;
          if ((mesh->mBones).
              super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (mesh->mBones).
              super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar21 = 1;
            uVar22 = 0;
            do {
              if ((&((local_80.
                      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                      ._M_impl.super__Vector_impl_data._M_start)->super_Material)._vptr_Material)
                  [uVar22 * 3] !=
                  (_func_int **)
                  (&((local_80.
                      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                      ._M_impl.super__Vector_impl_data._M_start)->super_Material).mName._M_dataplus)
                  [uVar22 * 3]._M_p) {
                local_a8->mNumBones = local_a8->mNumBones + 1;
              }
              uVar22 = (ulong)uVar21;
              uVar21 = uVar21 + 1;
            } while (uVar22 < (ulong)((long)(mesh->mBones).
                                            super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(mesh->mBones).
                                            super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          ppaVar34 = (aiBone **)operator_new__((ulong)local_a8->mNumBones << 3);
          paVar27->mBones = ppaVar34;
          if ((mesh->mBones).
              super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (mesh->mBones).
              super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar21 = 1;
            uVar22 = 0;
            do {
              local_a0 = (aiMesh *)(uVar22 * 3);
              if ((&((local_80.
                      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                      ._M_impl.super__Vector_impl_data._M_start)->super_Material)._vptr_Material)
                  [uVar22 * 3] !=
                  (_func_int **)
                  (&((local_80.
                      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                      ._M_impl.super__Vector_impl_data._M_start)->super_Material).mName._M_dataplus)
                  [uVar22 * 3]._M_p) {
                local_68 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                           CONCAT44(local_68._4_4_,uVar21);
                local_88 = ppaVar34;
                paVar35 = (aiBone *)operator_new(0x450);
                (paVar35->mName).length = 0;
                (paVar35->mName).data[0] = '\0';
                memset((paVar35->mName).data + 1,0x1b,0x3ff);
                paVar35->mNumWeights = 0;
                paVar35->mWeights = (aiVertexWeight *)0x0;
                (paVar35->mOffsetMatrix).a1 = 1.0;
                (paVar35->mOffsetMatrix).a2 = 0.0;
                (paVar35->mOffsetMatrix).a3 = 0.0;
                (paVar35->mOffsetMatrix).a4 = 0.0;
                (paVar35->mOffsetMatrix).b1 = 0.0;
                (paVar35->mOffsetMatrix).b2 = 1.0;
                (paVar35->mOffsetMatrix).b3 = 0.0;
                (paVar35->mOffsetMatrix).b4 = 0.0;
                (paVar35->mOffsetMatrix).c1 = 0.0;
                (paVar35->mOffsetMatrix).c2 = 0.0;
                (paVar35->mOffsetMatrix).c3 = 1.0;
                (paVar35->mOffsetMatrix).c4 = 0.0;
                (paVar35->mOffsetMatrix).d1 = 0.0;
                (paVar35->mOffsetMatrix).d2 = 0.0;
                (paVar35->mOffsetMatrix).d3 = 0.0;
                (paVar35->mOffsetMatrix).d4 = 1.0;
                *local_88 = paVar35;
                pBVar4 = (mesh->mBones).
                         super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                uVar24 = pBVar4[uVar22].mName._M_string_length;
                if (uVar24 < 0x400) {
                  (paVar35->mName).length = (ai_uint32)uVar24;
                  memcpy((paVar35->mName).data,pBVar4[uVar22].mName._M_dataplus._M_p,uVar24);
                  (paVar35->mName).data[uVar24] = '\0';
                }
                local_90 = local_80.
                           super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                uVar25 = (long)(&((local_80.
                                   super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->super_Material).mName
                                 ._M_dataplus)[(long)local_a0]._M_p -
                         (long)(&((local_80.
                                   super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->super_Material).
                                 _vptr_Material)[(long)local_a0];
                uVar24 = (long)uVar25 >> 3;
                paVar35->mNumWeights = (uint)uVar24;
                uVar24 = uVar24 & 0xffffffff;
                uVar22 = uVar24 * 8;
                paVar36 = (aiVertexWeight *)operator_new__(uVar22);
                if (uVar24 != 0) {
                  memset(paVar36,0,uVar22);
                }
                paVar35->mWeights = paVar36;
                memcpy(paVar36,(&(local_90->super_Material)._vptr_Material)[(long)local_a0],
                       uVar25 & 0x7fffffff8);
                ppaVar34 = local_88 + 1;
                uVar21 = (uint)local_68;
              }
              uVar22 = (ulong)uVar21;
              uVar21 = uVar21 + 1;
            } while (uVar22 < (ulong)((long)(mesh->mBones).
                                            super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(mesh->mBones).
                                            super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          std::
          vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
          ::~vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                     *)&local_80);
        }
      }
    }
  }
  else {
    std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::vector
              (&local_80,&pMVar40[uVar21].avSubMaterials);
    pMVar20 = local_80.
              super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pMVar40 = local_80.
              super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar22 = ((long)local_80.
                    super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_80.
                   super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x2e0;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar22;
    uVar24 = SUB168(auVar10 * ZEXT816(0x18),0);
    uVar25 = uVar24 + 8;
    if (0xfffffffffffffff7 < uVar24) {
      uVar25 = 0xffffffffffffffff;
    }
    uVar24 = 0xffffffffffffffff;
    if (SUB168(auVar10 * ZEXT816(0x18),8) == 0) {
      uVar24 = uVar25;
    }
    puVar26 = (ulong *)operator_new__(uVar24);
    *puVar26 = uVar22;
    puVar28 = puVar26 + 1;
    if (pMVar20 != pMVar40) {
      memset(puVar28,0,((uVar22 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
    }
    local_a8 = (aiMesh *)((ulong)local_a8._4_4_ << 0x20);
    pFVar38 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
              super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_40 = puVar26;
    if ((mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
        super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
        super__Vector_impl_data._M_finish != pFVar38) {
      uVar22 = 0;
      do {
        uVar24 = (ulong)pFVar38[uVar22].iMaterial;
        uVar25 = ((long)local_80.
                        super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_80.
                        super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x2c8590b21642c859;
        if (uVar25 < uVar24 || uVar25 - uVar24 == 0) {
          pLVar23 = DefaultLogger::get();
          Logger::warn(pLVar23,"Submaterial index is out of range");
          lVar46 = (long)local_80.
                         super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_80.
                         super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          __position_01._M_current = (uint *)puVar26[lVar46 * -0x590b21642c8590b + -1];
          if (__position_01._M_current == (uint *)puVar26[lVar46 * -0x590b21642c8590b]) {
            lVar46 = lVar46 * -0x590b21642c8590b + -3;
            goto LAB_003f008f;
          }
          lVar46 = lVar46 * -0x590b21642c8590b + -2;
          *__position_01._M_current = (uint)local_a8;
LAB_003f0075:
          puVar28[lVar46] = puVar28[lVar46] + 4;
        }
        else {
          __position_01._M_current = (uint *)puVar26[uVar24 * 3 + 2];
          if (__position_01._M_current != (uint *)puVar26[uVar24 * 3 + 3]) {
            lVar46 = uVar24 * 3 + 1;
            *__position_01._M_current = (uint)uVar22;
            goto LAB_003f0075;
          }
          lVar46 = uVar24 * 3;
LAB_003f008f:
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)(puVar28 + lVar46),
                     __position_01,(uint *)&local_a8);
        }
        uVar22 = (ulong)((uint)local_a8 + 1);
        local_a8 = (aiMesh *)CONCAT44(local_a8._4_4_,(uint)local_a8 + 1);
        pFVar38 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                  super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar24 = ((long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                        super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pFVar38 >> 2) *
                 0xf83e0f83e0f83e1;
      } while (uVar22 <= uVar24 && uVar24 - uVar22 != 0);
    }
    if (local_80.super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_80.super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      local_68 = mesh->amTexCoords;
      local_60 = 0;
      local_58 = puVar28;
      do {
        uVar22 = local_60;
        if (puVar28[local_60 * 3] != puVar28[local_60 * 3 + 1]) {
          paVar27 = (aiMesh *)operator_new(0x520);
          paVar27->mPrimitiveTypes = 0;
          paVar27->mNumVertices = 0;
          paVar27->mNumFaces = 0;
          memset(&paVar27->mVertices,0,0xcc);
          paVar27->mBones = (aiBone **)0x0;
          paVar27->mMaterialIndex = 0;
          (paVar27->mName).length = 0;
          (paVar27->mName).data[0] = '\0';
          memset((paVar27->mName).data + 1,0x1b,0x3ff);
          paVar27->mNumAnimMeshes = 0;
          paVar27->mAnimMeshes = (aiAnimMesh **)0x0;
          paVar27->mMethod = 0;
          (paVar27->mAABB).mMin.x = 0.0;
          (paVar27->mAABB).mMin.y = 0.0;
          (paVar27->mAABB).mMin.z = 0.0;
          (paVar27->mAABB).mMax.x = 0.0;
          (paVar27->mAABB).mMax.y = 0.0;
          (paVar27->mAABB).mMax.z = 0.0;
          paVar27->mTextureCoords[0] = (aiVector3D *)0x0;
          paVar27->mTextureCoords[1] = (aiVector3D *)0x0;
          paVar27->mTextureCoords[2] = (aiVector3D *)0x0;
          paVar27->mTextureCoords[3] = (aiVector3D *)0x0;
          paVar27->mTextureCoords[4] = (aiVector3D *)0x0;
          paVar27->mTextureCoords[5] = (aiVector3D *)0x0;
          paVar27->mTextureCoords[6] = (aiVector3D *)0x0;
          paVar27->mTextureCoords[7] = (aiVector3D *)0x0;
          paVar27->mNumUVComponents[0] = 0;
          paVar27->mNumUVComponents[1] = 0;
          paVar27->mNumUVComponents[2] = 0;
          paVar27->mNumUVComponents[3] = 0;
          paVar27->mNumUVComponents[4] = 0;
          paVar27->mNumUVComponents[5] = 0;
          paVar27->mNumUVComponents[6] = 0;
          paVar27->mNumUVComponents[7] = 0;
          paVar27->mColors[0] = (aiColor4D *)0x0;
          paVar27->mColors[1] = (aiColor4D *)0x0;
          paVar27->mColors[2] = (aiColor4D *)0x0;
          paVar27->mColors[3] = (aiColor4D *)0x0;
          paVar27->mColors[4] = (aiColor4D *)0x0;
          paVar27->mColors[5] = (aiColor4D *)0x0;
          paVar27->mColors[6] = (aiColor4D *)0x0;
          paVar27->mColors[7] = (aiColor4D *)0x0;
          paVar27->mPrimitiveTypes = 4;
          paVar27->mMaterialIndex = (uint)local_60;
          *(undefined1 *)
           (*(long *)&(local_48->mParser->m_vMaterials).
                      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                      ._M_impl.super__Vector_impl_data._M_start[mesh->iMaterialIndex].avSubMaterials
                      .
                      super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                      ._M_impl + 0x2d8 + uVar22 * 0x2e0) = 1;
          paVar27->mColors[3] = (aiColor4D *)(ulong)mesh->iMaterialIndex;
          paVar27->mColors[2] = (aiColor4D *)mesh;
          iVar3._M_current = *(aiMesh ***)(local_50 + 8);
          local_a8 = paVar27;
          if (iVar3._M_current == *(aiMesh ***)(local_50 + 0x10)) {
            std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                      (local_50,iVar3,(aiMesh **)&local_a8);
          }
          else {
            *iVar3._M_current = paVar27;
            *(long *)(local_50 + 8) = *(long *)(local_50 + 8) + 8;
          }
          paVar27 = local_a8;
          local_90 = (pointer)(puVar28 + uVar22 * 3);
          local_a8->mNumVertices =
               (int)((ulong)((long)(local_90->super_Material).mName._M_dataplus._M_p -
                            (long)(local_90->super_Material)._vptr_Material) >> 2) * 3;
          local_a8->mNumFaces =
               (uint)((ulong)((long)(local_90->super_Material).mName._M_dataplus._M_p -
                             (long)(local_90->super_Material)._vptr_Material) >> 2);
          pBVar4 = (mesh->mBones).
                   super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl
                   .super__Vector_impl_data._M_start;
          pBVar5 = (mesh->mBones).
                   super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl
                   .super__Vector_impl_data._M_finish;
          if (pBVar4 == pBVar5) {
            local_a0 = (aiMesh *)0x0;
          }
          else {
            uVar25 = (long)pBVar5 - (long)pBVar4 >> 5;
            auVar11._8_8_ = 0;
            auVar11._0_8_ = uVar25;
            uVar22 = SUB168(auVar11 * ZEXT816(0x18),0);
            uVar24 = uVar22 + 8;
            if (0xfffffffffffffff7 < uVar22) {
              uVar24 = 0xffffffffffffffff;
            }
            if (SUB168(auVar11 * ZEXT816(0x18),8) != 0) {
              uVar24 = 0xffffffffffffffff;
            }
            puVar28 = (ulong *)operator_new__(uVar24);
            *puVar28 = uVar25;
            local_a0 = (aiMesh *)(puVar28 + 1);
            if (pBVar5 != pBVar4) {
              memset(local_a0,0,((uVar25 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
            }
          }
          uVar22 = (ulong)paVar27->mNumFaces;
          puVar28 = (ulong *)operator_new__(uVar22 * 0x10 + 8);
          *puVar28 = uVar22;
          paVar29 = (aiFace *)(puVar28 + 1);
          if (uVar22 != 0) {
            paVar39 = paVar29;
            do {
              paVar39->mNumIndices = 0;
              paVar39->mIndices = (uint *)0x0;
              paVar39 = paVar39 + 1;
            } while (paVar39 != paVar29 + uVar22);
          }
          paVar27->mFaces = paVar29;
          uVar21 = paVar27->mNumVertices;
          if (uVar21 != 0) {
            paVar30 = (aiVector3D *)operator_new__((ulong)uVar21 * 0xc);
            memset(paVar30,0,(((ulong)uVar21 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
            paVar27->mVertices = paVar30;
            uVar22 = (ulong)paVar27->mNumVertices;
            paVar30 = (aiVector3D *)operator_new__(uVar22 * 0xc);
            if (uVar22 != 0) {
              memset(paVar30,0,((uVar22 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
            }
            paVar27->mNormals = paVar30;
            pp_Var31 = (local_90->super_Material)._vptr_Material;
            if ((_func_int **)(local_90->super_Material).mName._M_dataplus._M_p != pp_Var31) {
              uVar22 = 0;
              uVar24 = 0;
              do {
                local_88 = (aiBone **)(ulong)*(uint *)((long)pp_Var31 + uVar22 * 4);
                local_38 = uVar22;
                puVar32 = (uint *)operator_new__(0xc);
                local_a8->mFaces[uVar22].mIndices = puVar32;
                local_a8->mFaces[uVar22].mNumIndices = 3;
                lVar46 = 0;
                do {
                  uVar25 = (ulong)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                                  super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                                  ._M_impl.super__Vector_impl_data._M_start[(long)local_88].
                                  super_FaceWithSmoothingGroup.mIndices[lVar46];
                  paVar6 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  paVar30 = local_a8->mVertices;
                  uVar21 = (uint)uVar24;
                  paVar30[uVar24].z = *(float *)((long)(paVar6 + uVar25) + 8);
                  paVar6 = paVar6 + uVar25;
                  fVar17 = paVar6->y;
                  paVar30 = paVar30 + uVar24;
                  paVar30->x = paVar6->x;
                  paVar30->y = fVar17;
                  paVar6 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  paVar30 = local_a8->mNormals;
                  paVar30[uVar24].z = paVar6[uVar25].z;
                  paVar6 = paVar6 + uVar25;
                  fVar17 = paVar6->y;
                  paVar30 = paVar30 + uVar24;
                  paVar30->x = paVar6->x;
                  paVar30->y = fVar17;
                  if ((mesh->mBones).
                      super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                      _M_impl.super__Vector_impl_data._M_start !=
                      (mesh->mBones).
                      super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    if (local_a0 == (aiMesh *)0x0) {
                      __assert_fail("avOutputBones",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/ASE/ASELoader.cpp"
                                    ,0x400,
                                    "void Assimp::ASEImporter::ConvertMeshes(ASE::Mesh &, std::vector<aiMesh *> &)"
                                   );
                    }
                    pBVar47 = (mesh->mBoneVertices).
                              super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    uVar24 = ((long)(mesh->mBoneVertices).
                                    super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar47 >> 3)
                             * -0x5555555555555555;
                    if ((uVar25 <= uVar24 && uVar24 - uVar25 != 0) &&
                       (ppVar45 = *(pointer *)
                                   &pBVar47[uVar25].mBoneWeights.
                                    super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                    ._M_impl,
                       ppVar45 !=
                       *(pointer *)
                        ((long)&(mesh->mBoneVertices).
                                super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar25].mBoneWeights.
                                super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                ._M_impl + 8))) {
                      do {
                        this_00 = (vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                                   *)((long)local_a0 + (long)ppVar45->first * 3 * 8);
                        local_98.second = ppVar45->second;
                        __position._M_current = *(pair<unsigned_int,_float> **)(this_00 + 8);
                        local_98.first = uVar21;
                        if (__position._M_current == *(pair<unsigned_int,_float> **)(this_00 + 0x10)
                           ) {
                          std::
                          vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                          ::_M_realloc_insert<std::pair<unsigned_int,float>>
                                    (this_00,__position,&local_98);
                        }
                        else {
                          pVar15.second = local_98.second;
                          pVar15.first = uVar21;
                          *__position._M_current = pVar15;
                          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
                        }
                        ppVar45 = ppVar45 + 1;
                      } while (ppVar45 !=
                               *(pointer *)
                                ((long)&(mesh->mBoneVertices).
                                        super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar25].
                                        mBoneWeights.
                                        super__Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                        ._M_impl + 8));
                    }
                  }
                  local_a8->mFaces[uVar22].mIndices[lVar46] = uVar21;
                  lVar46 = lVar46 + 1;
                  uVar24 = (ulong)(uVar21 + 1);
                } while (lVar46 != 3);
                uVar22 = (ulong)((int)local_38 + 1);
                pp_Var31 = (local_90->super_Material)._vptr_Material;
              } while (uVar22 < (ulong)((long)(local_90->super_Material).mName._M_dataplus._M_p -
                                        (long)pp_Var31 >> 2));
            }
          }
          lVar46 = 0;
          puVar28 = local_58;
          do {
            paVar27 = local_a8;
            if (local_68[lVar46].
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_68[lVar46].
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              uVar22 = (ulong)local_a8->mNumVertices;
              paVar30 = (aiVector3D *)operator_new__(uVar22 * 0xc);
              if (uVar22 != 0) {
                memset(paVar30,0,((uVar22 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
              }
              paVar27->mTextureCoords[lVar46] = paVar30;
              pp_Var31 = (local_90->super_Material)._vptr_Material;
              if ((_func_int **)(local_90->super_Material).mName._M_dataplus._M_p != pp_Var31) {
                uVar22 = 0;
                iVar41 = 0;
                do {
                  uVar21 = *(uint *)((long)pp_Var31 + uVar22 * 4);
                  lVar42 = 0;
                  do {
                    uVar43 = iVar41 + (int)lVar42;
                    uVar1 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                            super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar21].
                            super_FaceWithSmoothingGroup.mIndices[lVar42];
                    paVar6 = local_68[lVar46].
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    paVar30 = local_a8->mTextureCoords[lVar46];
                    paVar30[uVar43].z = paVar6[uVar1].z;
                    paVar6 = paVar6 + uVar1;
                    fVar17 = paVar6->y;
                    paVar30 = paVar30 + uVar43;
                    paVar30->x = paVar6->x;
                    paVar30->y = fVar17;
                    lVar42 = lVar42 + 1;
                  } while (lVar42 != 3);
                  uVar22 = (ulong)((int)uVar22 + 1);
                  pp_Var31 = (local_90->super_Material)._vptr_Material;
                  iVar41 = iVar41 + 3;
                } while (uVar22 < (ulong)((long)(local_90->super_Material).mName._M_dataplus._M_p -
                                          (long)pp_Var31 >> 2));
              }
              local_a8->mNumUVComponents[lVar46] = mesh->mNumUVComponents[lVar46];
              puVar28 = local_58;
            }
            paVar27 = local_a8;
            lVar46 = lVar46 + 1;
          } while (lVar46 != 8);
          if ((mesh->mVertexColors).
              super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (mesh->mVertexColors).
              super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            uVar21 = local_a8->mNumVertices;
            uVar22 = (ulong)uVar21 << 4;
            paVar33 = (aiColor4D *)operator_new__(uVar22);
            if ((ulong)uVar21 != 0) {
              memset(paVar33,0,uVar22);
            }
            paVar27->mColors[0] = paVar33;
            pp_Var31 = (local_90->super_Material)._vptr_Material;
            if ((_func_int **)(local_90->super_Material).mName._M_dataplus._M_p != pp_Var31) {
              uVar22 = 0;
              iVar41 = 0;
              do {
                uVar21 = *(uint *)((long)pp_Var31 + uVar22 * 4);
                lVar46 = 0;
                do {
                  paVar8 = (mesh->mVertexColors).
                           super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                           _M_impl.super__Vector_impl_data._M_start +
                           (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                           super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar21].
                           super_FaceWithSmoothingGroup.mIndices[lVar46];
                  fVar17 = paVar8->g;
                  fVar18 = paVar8->b;
                  fVar19 = paVar8->a;
                  paVar33 = paVar27->mColors[0] + (uint)(iVar41 + (int)lVar46);
                  paVar33->r = paVar8->r;
                  paVar33->g = fVar17;
                  paVar33->b = fVar18;
                  paVar33->a = fVar19;
                  lVar46 = lVar46 + 1;
                } while (lVar46 != 3);
                uVar22 = (ulong)((int)uVar22 + 1);
                pp_Var31 = (local_90->super_Material)._vptr_Material;
                iVar41 = iVar41 + 3;
              } while (uVar22 < (ulong)((long)(local_90->super_Material).mName._M_dataplus._M_p -
                                        (long)pp_Var31 >> 2));
            }
          }
          paVar27 = local_a8;
          if ((mesh->mBones).
              super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (mesh->mBones).
              super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_a8->mNumBones = 0;
            if ((mesh->mBones).
                super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (mesh->mBones).
                super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
                super__Vector_impl_data._M_start) {
              uVar21 = 1;
              uVar22 = 0;
              do {
                if (*(ulong *)((long)local_a0 + uVar22 * 3 * 8) !=
                    *(ulong *)((long)local_a0 + (uVar22 * 3 + 1) * 8)) {
                  local_a8->mNumBones = local_a8->mNumBones + 1;
                }
                uVar22 = (ulong)uVar21;
                uVar21 = uVar21 + 1;
              } while (uVar22 < (ulong)((long)(mesh->mBones).
                                              super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(mesh->mBones).
                                              super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 5));
            }
            ppaVar34 = (aiBone **)operator_new__((ulong)local_a8->mNumBones << 3);
            paVar27->mBones = ppaVar34;
            paVar27 = local_a0;
            if ((mesh->mBones).
                super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (mesh->mBones).
                super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>._M_impl.
                super__Vector_impl_data._M_start) {
              pMVar40 = (pointer)0x0;
              do {
                if (*(ulong *)((long)paVar27 + (long)pMVar40 * 3 * 8) !=
                    *(ulong *)((long)paVar27 + ((long)pMVar40 * 3 + 1) * 8)) {
                  local_90 = pMVar40;
                  local_88 = ppaVar34;
                  paVar35 = (aiBone *)operator_new(0x450);
                  (paVar35->mName).length = 0;
                  (paVar35->mName).data[0] = '\0';
                  memset((paVar35->mName).data + 1,0x1b,0x3ff);
                  paVar35->mNumWeights = 0;
                  paVar35->mWeights = (aiVertexWeight *)0x0;
                  (paVar35->mOffsetMatrix).a1 = 1.0;
                  (paVar35->mOffsetMatrix).a2 = 0.0;
                  (paVar35->mOffsetMatrix).a3 = 0.0;
                  (paVar35->mOffsetMatrix).a4 = 0.0;
                  (paVar35->mOffsetMatrix).b1 = 0.0;
                  (paVar35->mOffsetMatrix).b2 = 1.0;
                  (paVar35->mOffsetMatrix).b3 = 0.0;
                  (paVar35->mOffsetMatrix).b4 = 0.0;
                  (paVar35->mOffsetMatrix).c1 = 0.0;
                  (paVar35->mOffsetMatrix).c2 = 0.0;
                  (paVar35->mOffsetMatrix).c3 = 1.0;
                  (paVar35->mOffsetMatrix).c4 = 0.0;
                  (paVar35->mOffsetMatrix).d1 = 0.0;
                  (paVar35->mOffsetMatrix).d2 = 0.0;
                  (paVar35->mOffsetMatrix).d3 = 0.0;
                  (paVar35->mOffsetMatrix).d4 = 1.0;
                  *local_88 = paVar35;
                  pBVar4 = (mesh->mBones).
                           super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  uVar22 = pBVar4[(long)pMVar40].mName._M_string_length;
                  if (uVar22 < 0x400) {
                    (paVar35->mName).length = (ai_uint32)uVar22;
                    memcpy((paVar35->mName).data,pBVar4[(long)pMVar40].mName._M_dataplus._M_p,uVar22
                          );
                    (paVar35->mName).data[uVar22] = '\0';
                  }
                  puVar28 = (ulong *)((long)local_a0 + (long)pMVar40 * 3 * 8);
                  uVar24 = (long)(puVar28[1] - *puVar28) >> 3;
                  paVar35->mNumWeights = (uint)uVar24;
                  uVar24 = uVar24 & 0xffffffff;
                  uVar22 = uVar24 * 8;
                  paVar36 = (aiVertexWeight *)operator_new__(uVar22);
                  if (uVar24 != 0) {
                    memset(paVar36,0,uVar22);
                  }
                  paVar35->mWeights = paVar36;
                  if (paVar35->mNumWeights != 0) {
                    uVar22 = 0;
                    do {
                      uVar24 = *puVar28;
                      paVar35->mWeights[uVar22].mVertexId = *(uint *)(uVar24 + uVar22 * 8);
                      paVar35->mWeights[uVar22].mWeight = *(float *)(uVar24 + 4 + uVar22 * 8);
                      uVar22 = uVar22 + 1;
                    } while (uVar22 < paVar35->mNumWeights);
                  }
                  ppaVar34 = local_88 + 1;
                  pMVar40 = local_90;
                  puVar28 = local_58;
                  paVar27 = local_a0;
                }
                pMVar40 = (pointer)(ulong)((int)pMVar40 + 1);
              } while (pMVar40 < (pointer)((long)(mesh->mBones).
                                                 super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(mesh->mBones).
                                                 super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                                 ._M_impl.super__Vector_impl_data._M_start >> 5));
            }
            if (paVar27 != (aiMesh *)0x0) {
              if (*(ulong *)((long)paVar27 + -8) != 0) {
                lVar46 = *(ulong *)((long)paVar27 + -8) * 0x18;
                do {
                  pvVar37 = *(void **)((long)paVar27 + lVar46 + -0x18);
                  if (pvVar37 != (void *)0x0) {
                    operator_delete(pvVar37);
                  }
                  lVar46 = lVar46 + -0x18;
                } while (lVar46 != 0);
              }
              operator_delete__((ulong *)((long)paVar27 + -8));
            }
          }
        }
        local_60 = (ulong)((int)local_60 + 1);
        uVar22 = ((long)local_80.
                        super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_80.
                        super__Vector_base<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x2c8590b21642c859;
      } while (local_60 <= uVar22 && uVar22 - local_60 != 0);
    }
    puVar28 = local_40;
    if (*local_40 != 0) {
      lVar46 = *local_40 * 0x18;
      do {
        pvVar37 = *(void **)((long)puVar28 + lVar46 + -0x10);
        if (pvVar37 != (void *)0x0) {
          operator_delete(pvVar37);
        }
        lVar46 = lVar46 + -0x18;
      } while (lVar46 != 0);
    }
    operator_delete__(puVar28);
    std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::~vector(&local_80);
  }
  return;
}

Assistant:

void ASEImporter::ConvertMeshes(ASE::Mesh& mesh, std::vector<aiMesh*>& avOutMeshes)
{
    // validate the material index of the mesh
    if (mesh.iMaterialIndex >= mParser->m_vMaterials.size())    {
        mesh.iMaterialIndex = (unsigned int)mParser->m_vMaterials.size()-1;
        ASSIMP_LOG_WARN("Material index is out of range");
    }

    // If the material the mesh is assigned to is consisting of submeshes, split it
    if (!mParser->m_vMaterials[mesh.iMaterialIndex].avSubMaterials.empty()) {
        std::vector<ASE::Material> vSubMaterials = mParser->
            m_vMaterials[mesh.iMaterialIndex].avSubMaterials;

        std::vector<unsigned int>* aiSplit = new std::vector<unsigned int>[vSubMaterials.size()];

        // build a list of all faces per sub-material
        for (unsigned int i = 0; i < mesh.mFaces.size();++i)    {
            // check range
            if (mesh.mFaces[i].iMaterial >= vSubMaterials.size()) {
                ASSIMP_LOG_WARN("Submaterial index is out of range");

                // use the last material instead
                aiSplit[vSubMaterials.size()-1].push_back(i);
            }
            else aiSplit[mesh.mFaces[i].iMaterial].push_back(i);
        }

        // now generate submeshes
        for (unsigned int p = 0; p < vSubMaterials.size();++p)  {
            if (!aiSplit[p].empty())    {

                aiMesh* p_pcOut = new aiMesh();
                p_pcOut->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

                // let the sub material index
                p_pcOut->mMaterialIndex = p;

                // we will need this material
                mParser->m_vMaterials[mesh.iMaterialIndex].avSubMaterials[p].bNeed = true;

                // store the real index here ... color channel 3
                p_pcOut->mColors[3] = (aiColor4D*)(uintptr_t)mesh.iMaterialIndex;

                // store a pointer to the mesh in color channel 2
                p_pcOut->mColors[2] = (aiColor4D*) &mesh;
                avOutMeshes.push_back(p_pcOut);

                // convert vertices
                p_pcOut->mNumVertices = (unsigned int)aiSplit[p].size()*3;
                p_pcOut->mNumFaces = (unsigned int)aiSplit[p].size();

                // receive output vertex weights
                std::vector<std::pair<unsigned int, float> > *avOutputBones = NULL;
                if (!mesh.mBones.empty())   {
                    avOutputBones = new std::vector<std::pair<unsigned int, float> >[mesh.mBones.size()];
                }

                // allocate enough storage for faces
                p_pcOut->mFaces = new aiFace[p_pcOut->mNumFaces];

                unsigned int iBase = 0,iIndex;
                if (p_pcOut->mNumVertices)  {
                    p_pcOut->mVertices = new aiVector3D[p_pcOut->mNumVertices];
                    p_pcOut->mNormals  = new aiVector3D[p_pcOut->mNumVertices];
                    for (unsigned int q = 0; q < aiSplit[p].size();++q) {

                        iIndex = aiSplit[p][q];

                        p_pcOut->mFaces[q].mIndices = new unsigned int[3];
                        p_pcOut->mFaces[q].mNumIndices = 3;

                        for (unsigned int t = 0; t < 3;++t, ++iBase)    {
                            const uint32_t iIndex2 = mesh.mFaces[iIndex].mIndices[t];

                            p_pcOut->mVertices[iBase] = mesh.mPositions [iIndex2];
                            p_pcOut->mNormals [iBase] = mesh.mNormals   [iIndex2];

                            // convert bones, if existing
                            if (!mesh.mBones.empty()) {
                                ai_assert(avOutputBones);
                                // check whether there is a vertex weight for this vertex index
                                if (iIndex2 < mesh.mBoneVertices.size())    {

                                    for (std::vector<std::pair<int,float> >::const_iterator
                                        blubb =  mesh.mBoneVertices[iIndex2].mBoneWeights.begin();
                                        blubb != mesh.mBoneVertices[iIndex2].mBoneWeights.end();++blubb)    {

                                        // NOTE: illegal cases have already been filtered out
                                        avOutputBones[(*blubb).first].push_back(std::pair<unsigned int, float>(
                                            iBase,(*blubb).second));
                                    }
                                }
                            }
                            p_pcOut->mFaces[q].mIndices[t] = iBase;
                        }
                    }
                }
                // convert texture coordinates (up to AI_MAX_NUMBER_OF_TEXTURECOORDS sets supported)
                for (unsigned int c = 0; c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c) {
                    if (!mesh.amTexCoords[c].empty())
                    {
                        p_pcOut->mTextureCoords[c] = new aiVector3D[p_pcOut->mNumVertices];
                        iBase = 0;
                        for (unsigned int q = 0; q < aiSplit[p].size();++q) {
                            iIndex = aiSplit[p][q];
                            for (unsigned int t = 0; t < 3;++t) {
                                p_pcOut->mTextureCoords[c][iBase++] = mesh.amTexCoords[c][mesh.mFaces[iIndex].mIndices[t]];
                            }
                        }
                        // Setup the number of valid vertex components
                        p_pcOut->mNumUVComponents[c] = mesh.mNumUVComponents[c];
                    }
                }

                // Convert vertex colors (only one set supported)
                if (!mesh.mVertexColors.empty()){
                    p_pcOut->mColors[0] = new aiColor4D[p_pcOut->mNumVertices];
                    iBase = 0;
                    for (unsigned int q = 0; q < aiSplit[p].size();++q) {
                        iIndex = aiSplit[p][q];
                        for (unsigned int t = 0; t < 3;++t) {
                            p_pcOut->mColors[0][iBase++] = mesh.mVertexColors[mesh.mFaces[iIndex].mIndices[t]];
                        }
                    }
                }
                // Copy bones
                if (!mesh.mBones.empty())   {
                    p_pcOut->mNumBones = 0;
                    for (unsigned int mrspock = 0; mrspock < mesh.mBones.size();++mrspock)
                        if (!avOutputBones[mrspock].empty())p_pcOut->mNumBones++;

                    p_pcOut->mBones = new aiBone* [ p_pcOut->mNumBones ];
                    aiBone** pcBone = p_pcOut->mBones;
                    for (unsigned int mrspock = 0; mrspock < mesh.mBones.size();++mrspock)
                    {
                        if (!avOutputBones[mrspock].empty())    {
                            // we will need this bone. add it to the output mesh and
                            // add all per-vertex weights
                            aiBone* pc = *pcBone = new aiBone();
                            pc->mName.Set(mesh.mBones[mrspock].mName);

                            pc->mNumWeights = (unsigned int)avOutputBones[mrspock].size();
                            pc->mWeights = new aiVertexWeight[pc->mNumWeights];

                            for (unsigned int captainkirk = 0; captainkirk < pc->mNumWeights;++captainkirk)
                            {
                                const std::pair<unsigned int,float>& ref = avOutputBones[mrspock][captainkirk];
                                pc->mWeights[captainkirk].mVertexId = ref.first;
                                pc->mWeights[captainkirk].mWeight = ref.second;
                            }
                            ++pcBone;
                        }
                    }
                    // delete allocated storage
                    delete[] avOutputBones;
                }
            }
        }
        // delete storage
        delete[] aiSplit;
    }
    else
    {
        // Otherwise we can simply copy the data to one output mesh
        // This codepath needs less memory and uses fast memcpy()s
        // to do the actual copying. So I think it is worth the
        // effort here.

        aiMesh* p_pcOut = new aiMesh();
        p_pcOut->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

        // set an empty sub material index
        p_pcOut->mMaterialIndex = ASE::Face::DEFAULT_MATINDEX;
        mParser->m_vMaterials[mesh.iMaterialIndex].bNeed = true;

        // store the real index here ... in color channel 3
        p_pcOut->mColors[3] = (aiColor4D*)(uintptr_t)mesh.iMaterialIndex;

        // store a pointer to the mesh in color channel 2
        p_pcOut->mColors[2] = (aiColor4D*) &mesh;
        avOutMeshes.push_back(p_pcOut);

        // If the mesh hasn't faces or vertices, there are two cases
        // possible: 1. the model is invalid. 2. This is a dummy
        // helper object which we are going to remove later ...
        if (mesh.mFaces.empty() || mesh.mPositions.empty()) {
            return;
        }

        // convert vertices
        p_pcOut->mNumVertices = (unsigned int)mesh.mPositions.size();
        p_pcOut->mNumFaces = (unsigned int)mesh.mFaces.size();

        // allocate enough storage for faces
        p_pcOut->mFaces = new aiFace[p_pcOut->mNumFaces];

        // copy vertices
        p_pcOut->mVertices = new aiVector3D[mesh.mPositions.size()];
        memcpy(p_pcOut->mVertices,&mesh.mPositions[0],
            mesh.mPositions.size() * sizeof(aiVector3D));

        // copy normals
        p_pcOut->mNormals = new aiVector3D[mesh.mNormals.size()];
        memcpy(p_pcOut->mNormals,&mesh.mNormals[0],
            mesh.mNormals.size() * sizeof(aiVector3D));

        // copy texture coordinates
        for (unsigned int c = 0; c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c)    {
            if (!mesh.amTexCoords[c].empty())   {
                p_pcOut->mTextureCoords[c] = new aiVector3D[mesh.amTexCoords[c].size()];
                memcpy(p_pcOut->mTextureCoords[c],&mesh.amTexCoords[c][0],
                    mesh.amTexCoords[c].size() * sizeof(aiVector3D));

                // setup the number of valid vertex components
                p_pcOut->mNumUVComponents[c] = mesh.mNumUVComponents[c];
            }
        }

        // copy vertex colors
        if (!mesh.mVertexColors.empty())    {
            p_pcOut->mColors[0] = new aiColor4D[mesh.mVertexColors.size()];
            memcpy(p_pcOut->mColors[0],&mesh.mVertexColors[0],
                mesh.mVertexColors.size() * sizeof(aiColor4D));
        }

        // copy faces
        for (unsigned int iFace = 0; iFace < p_pcOut->mNumFaces;++iFace)    {
            p_pcOut->mFaces[iFace].mNumIndices = 3;
            p_pcOut->mFaces[iFace].mIndices = new unsigned int[3];

            // copy indices
            p_pcOut->mFaces[iFace].mIndices[0] = mesh.mFaces[iFace].mIndices[0];
            p_pcOut->mFaces[iFace].mIndices[1] = mesh.mFaces[iFace].mIndices[1];
            p_pcOut->mFaces[iFace].mIndices[2] = mesh.mFaces[iFace].mIndices[2];
        }

        // copy vertex bones
        if (!mesh.mBones.empty() && !mesh.mBoneVertices.empty())    {
            std::vector<std::vector<aiVertexWeight> > avBonesOut( mesh.mBones.size() );

            // find all vertex weights for this bone
            unsigned int quak = 0;
            for (std::vector<BoneVertex>::const_iterator harrypotter =  mesh.mBoneVertices.begin();
                harrypotter != mesh.mBoneVertices.end();++harrypotter,++quak)   {

                for (std::vector<std::pair<int,float> >::const_iterator
                    ronaldweasley  = (*harrypotter).mBoneWeights.begin();
                    ronaldweasley != (*harrypotter).mBoneWeights.end();++ronaldweasley)
                {
                    aiVertexWeight weight;
                    weight.mVertexId = quak;
                    weight.mWeight = (*ronaldweasley).second;
                    avBonesOut[(*ronaldweasley).first].push_back(weight);
                }
            }

            // now build a final bone list
            p_pcOut->mNumBones = 0;
            for (unsigned int jfkennedy = 0; jfkennedy < mesh.mBones.size();++jfkennedy)
                if (!avBonesOut[jfkennedy].empty())p_pcOut->mNumBones++;

            p_pcOut->mBones = new aiBone*[p_pcOut->mNumBones];
            aiBone** pcBone = p_pcOut->mBones;
            for (unsigned int jfkennedy = 0; jfkennedy < mesh.mBones.size();++jfkennedy)    {
                if (!avBonesOut[jfkennedy].empty()) {
                    aiBone* pc = *pcBone = new aiBone();
                    pc->mName.Set(mesh.mBones[jfkennedy].mName);
                    pc->mNumWeights = (unsigned int)avBonesOut[jfkennedy].size();
                    pc->mWeights = new aiVertexWeight[pc->mNumWeights];
                    ::memcpy(pc->mWeights,&avBonesOut[jfkennedy][0],
                        sizeof(aiVertexWeight) * pc->mNumWeights);
                    ++pcBone;
                }
            }
        }
    }
}